

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzidentifyrefpattern.cpp
# Opt level: O0

TPZAutoPointer<TPZRefPattern> __thiscall
TPZIdentifyRefPattern::GetUniform(TPZIdentifyRefPattern *this,TPZGeoEl *gel)

{
  ostream *this_00;
  void *this_01;
  long *in_RDX;
  string *in_RSI;
  TPZRefPattern *in_RDI;
  TPZRefPattern *rp;
  string fullfilename;
  MElementType eltype;
  string *in_stack_000001b8;
  TPZRefPattern *in_stack_000001c0;
  TPZRefPattern *this_02;
  string local_40 [36];
  int local_1c;
  
  this_02 = in_RDI;
  local_1c = (**(code **)(*in_RDX + 0xb8))();
  std::__cxx11::string::string(local_40,in_RSI);
  std::__cxx11::string::operator+=(local_40,"/");
  switch(local_1c) {
  case 0:
    std::__cxx11::string::operator+=(local_40,"Point_");
    break;
  case 1:
    std::__cxx11::string::operator+=(local_40,"Linear_");
    break;
  case 2:
    std::__cxx11::string::operator+=(local_40,"Triang_");
    break;
  case 3:
    std::__cxx11::string::operator+=(local_40,"Quad_");
    break;
  case 4:
    std::__cxx11::string::operator+=(local_40,"Tetra_");
    break;
  case 5:
    std::__cxx11::string::operator+=(local_40,"Piram_");
    break;
  case 6:
    std::__cxx11::string::operator+=(local_40,"Prism_");
    break;
  case 7:
    std::__cxx11::string::operator+=(local_40,"Hexa_");
    break;
  default:
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "TPZIdentifyRefPattern::GetUniform ERROR unknown eltype : ");
    this_01 = (void *)std::ostream::operator<<(this_00,local_1c);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    TPZAutoPointer<TPZRefPattern>::TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)this_02,in_RDI);
    goto LAB_01f666ce;
  }
  std::__cxx11::string::operator+=(local_40,"Unif.rpt");
  operator_new(0x360);
  TPZRefPattern::TPZRefPattern(in_stack_000001c0,in_stack_000001b8);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)this_02,in_RDI);
LAB_01f666ce:
  std::__cxx11::string::~string(local_40);
  return (TPZAutoPointer<TPZRefPattern>)(TPZReference *)this_02;
}

Assistant:

TPZAutoPointer<TPZRefPattern> TPZIdentifyRefPattern::GetUniform(TPZGeoEl * gel){
	MElementType eltype = gel->Type();
	string fullfilename = fPath;
	fullfilename += "/";
	switch (eltype) {
		case (EPoint) : {
			fullfilename += "Point_";
			break;
		}
		case (EOned) : {
			fullfilename += "Linear_";
			break;
		}
		case (ETriangle) : {
			fullfilename += "Triang_";
			break;
		}
		case (EQuadrilateral) : {
			fullfilename += "Quad_";
			break;
		}
		case (ETetraedro) : {
			fullfilename += "Tetra_";
			break;
		}
		case (EPiramide)  : {
			fullfilename += "Piram_";
			break;
		}
		case (EPrisma) : {
			fullfilename += "Prism_";
			break;
		}
		case (ECube) : {
			fullfilename += "Hexa_";
			break;
		}
		default:{
			PZError << "TPZIdentifyRefPattern::GetUniform ERROR unknown eltype : " << eltype << endl;
			return (0);
		}
	}
	fullfilename += "Unif.rpt";
	TPZRefPattern *rp = new TPZRefPattern(fullfilename);
	return rp;
}